

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall resetOnNewSessionFixture::~resetOnNewSessionFixture(resetOnNewSessionFixture *this)

{
  MemoryStoreFactory *this_00;
  
  this_00 = &this[-1].super_acceptorFixture.super_sessionFixture.factory;
  anon_unknown.dwarf_5319c9::sessionFixture::~sessionFixture((sessionFixture *)this_00);
  operator_delete(this_00,0x640);
  return;
}

Assistant:

resetOnNewSessionFixture() {
    now.setCurrent();
    startTime = now;
    startTime += -2;
    endTime = now;
    endTime += 2;

    acceptorFixture::createSession(0);
  }